

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O1

filepos_t __thiscall
libebml::EbmlMaster::RenderData
          (EbmlMaster *this,IOCallback *output,bool bForceRender,bool bWithDefault)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  filepos_t fVar3;
  pointer ppEVar4;
  filepos_t fVar5;
  undefined7 in_register_00000011;
  ulong uVar6;
  MemIOCallback TmpBuf;
  MemIOCallback local_80;
  
  if (((int)CONCAT71(in_register_00000011,bForceRender) == 0) &&
     (bVar1 = CheckMandatory(this), !bVar1)) {
    __assert_fail("CheckMandatory()",
                  "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/EbmlMaster.cpp"
                  ,0x60,
                  "virtual filepos_t libebml::EbmlMaster::RenderData(IOCallback &, bool, bool)");
  }
  if (this->bChecksumUsed == false) {
    ppEVar4 = (this->ElementList).
              super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->ElementList).
        super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>._M_impl.
        super__Vector_impl_data._M_finish == ppEVar4) {
      fVar3 = 0;
    }
    else {
      fVar3 = 0;
      uVar6 = 0;
      do {
        if ((bWithDefault) ||
           (iVar2 = (*ppEVar4[uVar6]->_vptr_EbmlElement[0xf])(), (char)iVar2 == '\0')) {
          fVar5 = EbmlElement::Render((this->ElementList).
                                      super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar6],output,
                                      bWithDefault,false,bForceRender);
          fVar3 = fVar3 + fVar5;
        }
        uVar6 = uVar6 + 1;
        ppEVar4 = (this->ElementList).
                  super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar6 < (ulong)((long)(this->ElementList).
                                     super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar4 >> 3
                              ));
    }
  }
  else {
    iVar2 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
    MemIOCallback::MemIOCallback(&local_80,CONCAT44(extraout_var,iVar2) - 6);
    ppEVar4 = (this->ElementList).
              super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->ElementList).
        super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppEVar4) {
      uVar6 = 0;
      do {
        if ((bWithDefault) ||
           (iVar2 = (*ppEVar4[uVar6]->_vptr_EbmlElement[0xf])(), (char)iVar2 == '\0')) {
          EbmlElement::Render((this->ElementList).
                              super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar6],
                              &local_80.super_IOCallback,bWithDefault,false,bForceRender);
        }
        uVar6 = uVar6 + 1;
        ppEVar4 = (this->ElementList).
                  super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar6 < (ulong)((long)(this->ElementList).
                                     super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar4 >> 3
                              ));
    }
    EbmlCrc32::FillCRC32(&this->Checksum,local_80.dataBuffer,(uint32)local_80.dataBufferTotalSize);
    fVar3 = EbmlElement::Render((EbmlElement *)&this->Checksum,output,true,false,bForceRender);
    IOCallback::writeFully
              (output,local_80.dataBuffer,
               CONCAT44(local_80.dataBufferTotalSize._4_4_,(uint32)local_80.dataBufferTotalSize));
    fVar3 = fVar3 + CONCAT44(local_80.dataBufferTotalSize._4_4_,(uint32)local_80.dataBufferTotalSize
                            );
    MemIOCallback::~MemIOCallback(&local_80);
  }
  return fVar3;
}

Assistant:

filepos_t EbmlMaster::RenderData(IOCallback & output, bool bForceRender, bool bWithDefault)
{
  filepos_t Result = 0;
  size_t Index;

  if (!bForceRender) {
    assert(CheckMandatory());
  }

  if (!bChecksumUsed) { // old school
    for (Index = 0; Index < ElementList.size(); Index++) {
      if (!bWithDefault && (ElementList[Index])->IsDefaultValue())
        continue;
      Result += (ElementList[Index])->Render(output, bWithDefault, false ,bForceRender);
    }
  } else { // new school
    MemIOCallback TmpBuf(GetSize() - 6);
    for (Index = 0; Index < ElementList.size(); Index++) {
      if (!bWithDefault && (ElementList[Index])->IsDefaultValue())
        continue;
      (ElementList[Index])->Render(TmpBuf, bWithDefault, false ,bForceRender);
    }
    Checksum.FillCRC32(TmpBuf.GetDataBuffer(), TmpBuf.GetDataBufferSize());
    Result += Checksum.Render(output, true, false ,bForceRender);
    output.writeFully(TmpBuf.GetDataBuffer(), TmpBuf.GetDataBufferSize());
    Result += TmpBuf.GetDataBufferSize();
  }

  return Result;
}